

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall FIX::Parser::extractLength(Parser *this,int *length,size_type *pos,string *buffer)

{
  int iVar1;
  long lVar2;
  long lVar3;
  MessageParseError *this_00;
  allocator<char> local_71;
  string local_70;
  string strLength;
  
  if (buffer->_M_string_length != 0) {
    lVar2 = std::__cxx11::string::find((char *)buffer,0x1ca553);
    if (lVar2 == -1) {
      return false;
    }
    lVar3 = std::__cxx11::string::find((char *)buffer,0x1ca557);
    if (lVar3 != -1) {
      std::__cxx11::string::string
                ((string *)&strLength,(string *)buffer,lVar2 + 3U,lVar3 - (lVar2 + 3U));
      iVar1 = IntTConvertor<int>::convert(&strLength);
      *length = iVar1;
      if (-1 < iVar1) {
        *pos = lVar3 + 1;
        std::__cxx11::string::~string((string *)&strLength);
        return true;
      }
      this_00 = (MessageParseError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
      MessageParseError::MessageParseError(this_00,&local_70);
      __cxa_throw(this_00,&MessageParseError::typeinfo,Exception::~Exception);
    }
  }
  return false;
}

Assistant:

EXCEPT(MessageParseError) {
  if (!buffer.size()) {
    return false;
  }

  std::string::size_type startPos = buffer.find("\0019=", 0);
  if (startPos == std::string::npos) {
    return false;
  }
  startPos += 3;
  std::string::size_type endPos = buffer.find("\001", startPos);
  if (endPos == std::string::npos) {
    return false;
  }

  std::string strLength(buffer, startPos, endPos - startPos);

  try {
    length = IntConvertor::convert(strLength);
    if (length < 0) {
      throw MessageParseError();
    }
  } catch (FieldConvertError &) {
    throw MessageParseError();
  }

  pos = endPos + 1;
  return true;
}